

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

int rsa1_load_s_internal
              (BinarySource *src,RSAKey *key,_Bool pub_only,char **commentptr,char *passphrase,
              char **error)

{
  size_t sVar1;
  _Bool _Var2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  unsigned_long uVar7;
  char *pcVar8;
  strbuf *buf_o;
  size_t sVar9;
  mp_int *pmVar10;
  uint uVar11;
  BinarySource *src_00;
  ulong wanted;
  ptrlen data;
  ptrlen pVar12;
  uchar keybuf [16];
  undefined1 local_48 [24];
  
  *error = "not an SSH-1 RSA file";
  pVar12.len = 0x21;
  pVar12.ptr = "SSH PRIVATE KEY FILE FORMAT 1.1\n";
  _Var2 = expect_signature(src,pVar12);
  uVar11 = 0;
  if (_Var2) {
    *error = "file format error";
    uVar3 = BinarySource_get_byte(src->binarysource_);
    if (((uVar3 == '\x03') || (uVar3 == '\0')) &&
       (uVar7 = BinarySource_get_uint32(src->binarysource_), uVar7 == 0)) {
      BinarySource_get_rsa_ssh1_pub(src->binarysource_,key,RSA_SSH1_MODULUS_FIRST);
      pVar12 = BinarySource_get_string(src->binarysource_);
      if (commentptr != (char **)0x0) {
        pcVar8 = mkstr(pVar12);
        *commentptr = pcVar8;
      }
      if (key == (RSAKey *)0x0) {
        uVar11 = 1;
        if (!pub_only) {
          uVar11 = (uint)(uVar3 != '\0');
          *error = (char *)0x0;
        }
      }
      else {
        pcVar8 = mkstr(pVar12);
        key->comment = pcVar8;
        uVar11 = 1;
        if (!pub_only) {
          src_00 = src->binarysource_;
          if (uVar3 == '\0') {
            buf_o = (strbuf *)0x0;
          }
          else {
            wanted = src_00->len - src_00->pos;
            if ((wanted & 7) != 0) {
              return 0;
            }
            pVar12 = BinarySource_get_data(src_00,wanted);
            buf_o = strbuf_dup_nm(pVar12);
            sVar9 = strlen(passphrase);
            data.len = sVar9;
            data.ptr = passphrase;
            hash_simple(&ssh_md5,data,local_48);
            des3_decrypt_pubkey(local_48,buf_o->u,(int)wanted);
            smemclr(local_48,0x10);
            sVar1 = buf_o->len;
            src->data = buf_o->u;
            src->len = sVar1;
            src->pos = 0;
            src->err = BSE_NO_ERROR;
            src->binarysource_ = src;
            src_00 = src;
          }
          uVar3 = BinarySource_get_byte(src_00);
          uVar4 = BinarySource_get_byte(src->binarysource_);
          uVar5 = BinarySource_get_byte(src->binarysource_);
          uVar6 = BinarySource_get_byte(src->binarysource_);
          if ((uVar3 == uVar5) && (uVar4 == uVar6)) {
            BinarySource_get_rsa_ssh1_priv(src->binarysource_,key);
            pmVar10 = BinarySource_get_mp_ssh1(src->binarysource_);
            key->iqmp = pmVar10;
            pmVar10 = BinarySource_get_mp_ssh1(src->binarysource_);
            key->q = pmVar10;
            pmVar10 = BinarySource_get_mp_ssh1(src->binarysource_);
            key->p = pmVar10;
            _Var2 = rsa_verify(key);
            if (_Var2) {
              *error = (char *)0x0;
              uVar11 = 1;
            }
            else {
              *error = "rsa_verify failed";
              freersakey(key);
              uVar11 = 0;
            }
          }
          else {
            *error = "wrong passphrase";
            uVar11 = 0xffffffff;
          }
          if (buf_o != (strbuf *)0x0) {
            strbuf_free(buf_o);
          }
        }
      }
    }
  }
  return uVar11;
}

Assistant:

static int rsa1_load_s_internal(BinarySource *src, RSAKey *key, bool pub_only,
                                char **commentptr, const char *passphrase,
                                const char **error)
{
    strbuf *buf = NULL;
    int ciphertype;
    int ret = 0;
    ptrlen comment;

    *error = "not an SSH-1 RSA file";

    if (!expect_signature(src, rsa1_signature))
        goto end;

    *error = "file format error";

    /* One byte giving encryption type, and one reserved uint32. */
    ciphertype = get_byte(src);
    if (ciphertype != 0 && ciphertype != SSH1_CIPHER_3DES)
        goto end;
    if (get_uint32(src) != 0)
        goto end;                 /* reserved field nonzero, panic! */

    /* Now the serious stuff. An ordinary SSH-1 public key. */
    get_rsa_ssh1_pub(src, key, RSA_SSH1_MODULUS_FIRST);

    /* Next, the comment field. */
    comment = get_string(src);
    if (commentptr)
        *commentptr = mkstr(comment);
    if (key)
        key->comment = mkstr(comment);

    if (pub_only) {
        ret = 1;
        goto end;
    }

    if (!key) {
        ret = ciphertype != 0;
        *error = NULL;
        goto end;
    }

    /*
     * Decrypt remainder of buffer.
     */
    if (ciphertype) {
        size_t enclen = get_avail(src);
        if (enclen & 7)
            goto end;

        buf = strbuf_dup_nm(get_data(src, enclen));

        unsigned char keybuf[16];
        hash_simple(&ssh_md5, ptrlen_from_asciz(passphrase), keybuf);
        des3_decrypt_pubkey(keybuf, buf->u, enclen);
        smemclr(keybuf, sizeof(keybuf));        /* burn the evidence */

        BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(buf));
    }

    /*
     * We are now in the secret part of the key. The first four
     * bytes should be of the form a, b, a, b.
     */
    {
        int b0a = get_byte(src);
        int b1a = get_byte(src);
        int b0b = get_byte(src);
        int b1b = get_byte(src);
        if (b0a != b0b || b1a != b1b) {
            *error = "wrong passphrase";
            ret = -1;
            goto end;
        }
    }

    /*
     * After that, we have one further bignum which is our
     * decryption exponent, and then the three auxiliary values
     * (iqmp, q, p).
     */
    get_rsa_ssh1_priv(src, key);
    key->iqmp = get_mp_ssh1(src);
    key->q = get_mp_ssh1(src);
    key->p = get_mp_ssh1(src);

    if (!rsa_verify(key)) {
        *error = "rsa_verify failed";
        freersakey(key);
        ret = 0;
    } else {
        *error = NULL;
        ret = 1;
    }

  end:
    if (buf)
        strbuf_free(buf);
    return ret;
}